

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region_grow.cpp
# Opt level: O1

int rg::get_important_obstacles
              (RGProblem *problem,RGRegion *region,
              vector<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
              *obstacles)

{
  uint uVar1;
  pointer pRVar2;
  bool bVar3;
  Vector3i *dst;
  pointer pRVar4;
  int iVar5;
  ulong unaff_RBP;
  Vector3i *pVVar7;
  int *src;
  Vector3i local_28;
  Vector3i local_1c;
  undefined8 uVar6;
  
  pRVar4 = (region->region_bound_pts).super__Vector_base<rg::RGPoint,_std::allocator<rg::RGPoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (region->region_bound_pts).super__Vector_base<rg::RGPoint,_std::allocator<rg::RGPoint>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pRVar4 == pRVar2) {
    local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         -10000;
    local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         10000;
    local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         10000;
    local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         0xffffd8f0;
    local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         10000;
    local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         -10000;
  }
  else {
    local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         10000;
    local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         -10000;
    local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         0xffffd8f0;
    local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         10000;
    local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         -10000;
    local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         10000;
    do {
      iVar5 = (pRVar4->point).super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0];
      if (local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [0] < iVar5) {
        local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
             = iVar5;
      }
      if (iVar5 < local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[0]) {
        local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
             = iVar5;
      }
      iVar5 = (pRVar4->point).super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[1];
      if (local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [1] < iVar5) {
        local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
             = iVar5;
      }
      if (iVar5 < local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[1]) {
        local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
             = iVar5;
      }
      uVar1 = (pRVar4->point).super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[2];
      unaff_RBP = (ulong)uVar1;
      if (local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [2] < (int)uVar1) {
        local_1c.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
             = uVar1;
      }
      if ((int)uVar1 <
          local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
          [2]) {
        local_28.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
             = uVar1;
      }
      pRVar4 = pRVar4 + 1;
    } while (pRVar4 != pRVar2);
  }
  pVVar7 = &local_1c;
  RGProblem::getInnerObstacles(problem,pVVar7,&local_28,obstacles);
  src = *(int **)(pVVar7->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data.array;
  pVVar7 = *(Vector3i **)
            ((pVVar7->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.m_data.
             array + 2);
  uVar6 = CONCAT71((int7)(unaff_RBP >> 8),(Vector3i *)src == pVVar7);
  iVar5 = (int)uVar6;
  if ((Vector3i *)src != pVVar7) {
    bVar3 = RGProblem::isObstacleOnPath(problem,(Vector3i *)src,dst,obstacles);
    while (!bVar3) {
      src = src + 4;
      uVar6 = CONCAT71((int7)((ulong)uVar6 >> 8),(Vector3i *)src == pVVar7);
      iVar5 = (int)uVar6;
      if ((Vector3i *)src == pVVar7) {
        return iVar5;
      }
      bVar3 = RGProblem::isObstacleOnPath(problem,(Vector3i *)src,dst,obstacles);
    }
  }
  return iVar5;
}

Assistant:

int get_important_obstacles(const RGProblem &problem, const RGRegion &region, std::vector<Eigen::Vector3i> *obstacles)
{
  int max_x = -10000;
  int min_x = 10000; 
  int max_y = -10000;
  int min_y = 10000; 
  int max_z = -10000;
  int min_z = 10000;
  for (auto it = region.region_bound_pts.cbegin(); it != region.region_bound_pts.cend(); ++it)
  {
    if (it->point.x() > max_x)
      max_x = it->point.x();
    if (it->point.x() < min_x)
      min_x = it->point.x();
    if (it->point.y() > max_y)
      max_y = it->point.y();
    if (it->point.y() < min_y)
      min_y = it->point.y();
    if (it->point.z() > max_z)
      max_z = it->point.z();
    if (it->point.z() < min_z)
      min_z = it->point.z();
  }

  problem.getInnerObstacles(Eigen::Vector3i(max_x, max_y, max_z), Eigen::Vector3i(min_x, min_y, min_z), obstacles);

  return OK;
}